

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

void __thiscall
JsrtDebugManager::JsrtDebugManager(JsrtDebugManager *this,ThreadContext *threadContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContext *threadContext_local;
  JsrtDebugManager *this_local;
  
  Js::HaltCallback::HaltCallback(&this->super_HaltCallback);
  Js::DebuggerOptionsCallback::DebuggerOptionsCallback(&this->super_DebuggerOptionsCallback);
  HostDebugContext::HostDebugContext(&this->super_HostDebugContext,(ScriptContext *)0x0);
  (this->super_HaltCallback)._vptr_HaltCallback = (_func_int **)&PTR_CanHalt_01dd17b0;
  (this->super_DebuggerOptionsCallback)._vptr_DebuggerOptionsCallback =
       (_func_int **)&PTR_IsExceptionReportingEnabled_01dd1820;
  (this->super_HostDebugContext)._vptr_HostDebugContext = (_func_int **)&PTR_Delete_01dd1850;
  this->threadContext = threadContext;
  this->debugEventCallback = (JsDiagDebugEventCallback)0x0;
  this->callbackState = (void *)0x0;
  this->resumeAction = BREAKRESUMEACTION_CONTINUE;
  this->debugObjectArena = (ArenaAllocator *)0x0;
  this->debuggerObjectsManager = (JsrtDebuggerObjectsManager *)0x0;
  this->debugDocumentManager = (JsrtDebugDocumentManager *)0x0;
  this->stackFrames = (JsrtDebugStackFrames *)0x0;
  this->breakOnExceptionAttributes = JsDiagBreakOnExceptionAttributeUncaught;
  if (threadContext == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                       ,0x1b,"(threadContext != nullptr)","threadContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

JsrtDebugManager::JsrtDebugManager(ThreadContext* threadContext) :
    HostDebugContext(nullptr),
    threadContext(threadContext),
    debugEventCallback(nullptr),
    callbackState(nullptr),
    resumeAction(BREAKRESUMEACTION_CONTINUE),
    debugObjectArena(nullptr),
    debuggerObjectsManager(nullptr),
    debugDocumentManager(nullptr),
    stackFrames(nullptr),
    breakOnExceptionAttributes(JsDiagBreakOnExceptionAttributeUncaught)
{
    Assert(threadContext != nullptr);
}